

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::ReadCollectionFont
               (Buffer *file,uint8_t *data,size_t len,Font *font,
               map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
               *all_tables)

{
  _Base_ptr *__k;
  bool bVar1;
  iterator iVar2;
  mapped_type *ppTVar3;
  Table *pTVar4;
  _Base_ptr p_Var5;
  
  bVar1 = Buffer::ReadU32(file,&font->flavor);
  if ((bVar1) && (bVar1 = ReadTrueTypeFont(file,data,len,font), bVar1)) {
    for (p_Var5 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(font->tables)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      __k = &p_Var5[1]._M_left;
      iVar2 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
              ::find(&all_tables->_M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar2._M_node == &(all_tables->_M_t)._M_impl.super__Rb_tree_header) {
        pTVar4 = Font::FindTable(font,*(uint32_t *)&p_Var5[1]._M_parent);
        ppTVar3 = std::
                  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                  ::operator[](all_tables,(key_type *)__k);
        *ppTVar3 = pTVar4;
      }
      else {
        ppTVar3 = std::
                  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                  ::operator[](all_tables,(key_type *)__k);
        p_Var5[2]._M_right = (_Base_ptr)*ppTVar3;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool ReadCollectionFont(Buffer* file, const uint8_t* data, size_t len,
                        Font* font,
                        std::map<uint32_t, Font::Table*>* all_tables) {
  if (!file->ReadU32(&font->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (!ReadTrueTypeFont(file, data, len, font)) {
    return FONT_COMPRESSION_FAILURE();
  }

  for (auto& entry : font->tables) {
    Font::Table& table = entry.second;

    if (all_tables->find(table.offset) == all_tables->end()) {
      (*all_tables)[table.offset] = font->FindTable(table.tag);
    } else {
      table.reuse_of = (*all_tables)[table.offset];
    }

  }
  return true;
}